

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

int Extra_bddVarIsInCube(DdNode *bCube,int iVar)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  DdNode *pDVar5;
  
  piVar3 = (int *)((ulong)bCube & 0xfffffffffffffffe);
  iVar2 = *piVar3;
  do {
    if (iVar2 == 0x7fffffff) {
      return -1;
    }
    uVar1 = *(ulong *)(piVar3 + 6);
    uVar4 = (ulong)((uint)bCube & 1);
    pDVar5 = (DdNode *)(uVar4 ^ uVar1);
    bCube = (DdNode *)(uVar4 ^ *(ulong *)(piVar3 + 4));
    if ((((ulong)pDVar5 & 1) == 0) || (*(int *)(uVar1 & 0xfffffffffffffffe) != 0x7fffffff)) {
      if ((((ulong)bCube & 1) == 0) ||
         (*(int *)(*(ulong *)(piVar3 + 4) & 0xfffffffffffffffe) != 0x7fffffff)) {
        __assert_fail("(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddMisc.c"
                      ,0x429,"int Extra_bddVarIsInCube(DdNode *, int)");
      }
      if (iVar2 == iVar) {
        if (((ulong)pDVar5 & 1) == 0) {
          return 0;
        }
        goto LAB_00820d6d;
      }
      if ((((ulong)pDVar5 & 1) == 0) || (*(int *)(uVar1 & 0xfffffffffffffffe) != 0x7fffffff)) {
        bCube = pDVar5;
      }
    }
    else if (iVar2 == iVar) {
LAB_00820d6d:
      return (uint)(*(int *)(uVar1 & 0xfffffffffffffffe) == 0x7fffffff);
    }
    piVar3 = (int *)((ulong)bCube & 0xfffffffffffffffe);
    iVar2 = *piVar3;
  } while( true );
}

Assistant:

int Extra_bddVarIsInCube( DdNode * bCube, int iVar )
{
    DdNode * bCube0, * bCube1;
    while ( Cudd_Regular(bCube)->index != CUDD_CONST_INDEX )
    {
        bCube0 = Cudd_NotCond( cuddE(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        bCube1 = Cudd_NotCond( cuddT(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        // make sure it is a cube
        assert( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || // bCube0 == 0
                (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX) ); // bCube1 == 0
        // quit if it is the last one
        if ( Cudd_Regular(bCube)->index == iVar )
            return (int)(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX);
        // get the next cube
        if ( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) )
            bCube = bCube1;
        else
            bCube = bCube0;
    }
    return -1;
}